

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O0

int getPipeValue(int param,Link *link,double *value,Network *nw)

{
  bool bVar1;
  int iVar2;
  undefined1 local_58 [40];
  Pipe *pipe;
  double lcf;
  Network *nw_local;
  double *value_local;
  Link *link_local;
  int param_local;
  
  lcf = (double)nw;
  nw_local = (Network *)value;
  value_local = (double *)link;
  link_local._0_4_ = param;
  pipe = (Pipe *)Network::ucf(nw,LENGTH);
  (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  iVar2 = (**(code **)((long)*value_local + 0x10))();
  if (iVar2 == 0) {
    local_58._32_8_ = value_local;
    switch((int)link_local) {
    case 1:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(value_local[0x14] * (double)pipe);
      break;
    case 2:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)value_local[0x15];
      Network::option_abi_cxx11_((Network *)local_58,SUB84(lcf,0));
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"D-W");
      std::__cxx11::string::~string((string *)local_58);
      if (bVar1) {
        (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((double)pipe * 1000.0 *
                      (double)(nw_local->graph).adjLists.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      break;
    default:
      return 0xcb;
    case 6:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)value_local[0x1a];
      break;
    case 7:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)value_local[0x1b];
      break;
    case 0xf:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)value_local[0x18];
      break;
    case 0x10:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)value_local[0x19];
      return 0xcb;
    }
  }
  return 0;
}

Assistant:

int getPipeValue(int param, Link* link, double* value, Network* nw)
{
    double lcf = nw->ucf(Units::LENGTH);
    *value = 0.0;
    if ( link->type() != Link::PIPE ) return 0;
    Pipe* pipe = static_cast<Pipe*>(link);
    switch (param)
    {
    case EN_LENGTH:
        *value = pipe->length * lcf;
        break;
    case EN_ROUGHNESS:
        *value = pipe->roughness;
        if ( nw->option(Options::HEADLOSS_MODEL) == "D-W") *value *= 1000.0 * lcf;
        break;
    case EN_KBULK:
        *value = pipe->bulkCoeff;
        break;
    case EN_KWALL:
        *value = pipe->wallCoeff;
        break;
    case EN_LEAKCOEFF1:
        *value = pipe->leakCoeff1;
        break;
    case EN_LEAKCOEFF2:
        *value = pipe->leakCoeff2;
    default: return 203;
    }
    return 0;
}